

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableFill
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableFill *curr)

{
  bool bVar1;
  ExpressionRunner<wasm::ModuleRunner> *pEVar2;
  Literal *pLVar3;
  ExternalInterface *pEVar4;
  Address local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  ulong local_180;
  uint64_t i;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  uint local_164;
  ulong uStack_160;
  Index tableSize;
  uint64_t size;
  Literal value;
  uint64_t dest;
  undefined1 local_120 [8];
  TableInstanceInfo info;
  Flow sizeFlow;
  Flow valueFlow;
  undefined1 local_68 [8];
  Flow destFlow;
  TableFill *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  destFlow.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar2,
             *(Expression **)(destFlow.breakTo.super_IString.str._M_str + 0x20));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&sizeFlow.breakTo.super_IString.str._M_str,pEVar2,
               *(Expression **)(destFlow.breakTo.super_IString.str._M_str + 0x28));
    bVar1 = Flow::breaking((Flow *)&sizeFlow.breakTo.super_IString.str._M_str);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&sizeFlow.breakTo.super_IString.str._M_str);
    }
    else {
      pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&info.name.super_IString.str._M_str,pEVar2,
                 *(Expression **)(destFlow.breakTo.super_IString.str._M_str + 0x30));
      bVar1 = Flow::breaking((Flow *)&info.name.super_IString.str._M_str);
      if (bVar1) {
        Flow::Flow(__return_storage_ptr__,(Flow *)&info.name.super_IString.str._M_str);
      }
      else {
        getTableInstanceInfo
                  ((TableInstanceInfo *)local_120,this,
                   (Name)((IString *)(destFlow.breakTo.super_IString.str._M_str + 0x10))->str);
        Flow::getSingleValue((Flow *)local_68);
        value.type.id = ::wasm::Literal::getUnsigned();
        pLVar3 = Flow::getSingleValue((Flow *)&sizeFlow.breakTo.super_IString.str._M_str);
        ::wasm::Literal::Literal((Literal *)&size,pLVar3);
        Flow::getSingleValue((Flow *)&info.name.super_IString.str._M_str);
        uStack_160 = ::wasm::Literal::getUnsigned();
        pEVar4 = TableInstanceInfo::interface((TableInstanceInfo *)local_120);
        i._0_4_ = info.instance._0_4_;
        i._4_4_ = info.instance._4_4_;
        uStack_170 = (undefined4)info.name.super_IString.str._M_len;
        uStack_16c = info.name.super_IString.str._M_len._4_4_;
        local_164 = (*pEVar4->_vptr_ExternalInterface[0x1b])
                              (pEVar4,CONCAT44(info.instance._4_4_,info.instance._0_4_),
                               CONCAT44(info.name.super_IString.str._M_len._4_4_,
                                        (undefined4)info.name.super_IString.str._M_len));
        if ((ulong)local_164 < value.type.id + uStack_160) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds table access");
        }
        for (local_180 = 0; local_180 < uStack_160; local_180 = local_180 + 1) {
          pEVar4 = TableInstanceInfo::interface((TableInstanceInfo *)local_120);
          local_198 = CONCAT44(info.instance._4_4_,info.instance._0_4_);
          uStack_190 = CONCAT44(info.name.super_IString.str._M_len._4_4_,
                                (undefined4)info.name.super_IString.str._M_len);
          Address::Address(&local_1a0,value.type.id + local_180);
          (*pEVar4->_vptr_ExternalInterface[0x1c])(pEVar4,local_198,uStack_190,local_1a0.addr,&size)
          ;
        }
        Flow::Flow(__return_storage_ptr__);
        ::wasm::Literal::~Literal((Literal *)&size);
      }
      Flow::~Flow((Flow *)&info.name.super_IString.str._M_str);
    }
    Flow::~Flow((Flow *)&sizeFlow.breakTo.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableFill(TableFill* curr) {
    NOTE_ENTER("TableFill");
    Flow destFlow = self()->visit(curr->dest);
    if (destFlow.breaking()) {
      return destFlow;
    }
    Flow valueFlow = self()->visit(curr->value);
    if (valueFlow.breaking()) {
      return valueFlow;
    }
    Flow sizeFlow = self()->visit(curr->size);
    if (sizeFlow.breaking()) {
      return sizeFlow;
    }
    auto info = getTableInstanceInfo(curr->table);

    auto dest = destFlow.getSingleValue().getUnsigned();
    Literal value = valueFlow.getSingleValue();
    auto size = sizeFlow.getSingleValue().getUnsigned();

    auto tableSize = info.interface()->tableSize(info.name);
    if (dest + size > tableSize) {
      trap("out of bounds table access");
    }

    for (uint64_t i = 0; i < size; i++) {
      info.interface()->tableStore(info.name, dest + i, value);
    }
    return Flow();
  }